

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnObj
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int index,
          Type type,NumericExpr expr)

{
  _Bit_type *p_Var1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  MutObjective local_30;
  
  BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::MutObjective
            (&local_30,this->builder_,index);
  iVar2 = local_30.
          super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ + 0x3f;
  if (-1 < (long)local_30.
                 super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_) {
    iVar2 = local_30.
            super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  }
  iVar2 = iVar2 >> 6;
  p_Var1 = ((local_30.
             super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
           is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  uVar4 = (ulong)(((long)local_30.
                         super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                         index_ & 0x800000000000003fU) < 0x8000000000000001);
  uVar3 = 1L << ((byte)local_30.
                       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                       index_ & 0x3f);
  if (type == MAX) {
    uVar3 = uVar3 | p_Var1[(long)iVar2 + uVar4 + 0xffffffffffffffff];
  }
  else {
    uVar3 = ~uVar3 & p_Var1[(long)iVar2 + uVar4 + 0xffffffffffffffff];
  }
  p_Var1[(long)iVar2 + uVar4 + 0xffffffffffffffff] = uVar3;
  BasicProblem<mp::BasicProblemParams<int>_>::SetNonlinearObjExpr
            (local_30.
             super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_,
             local_30.
             super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_,
             (NumericExpr)expr.super_ExprBase.impl_);
  (*this->_vptr_NLProblemBuilder[4])(this);
  return;
}

Assistant:

void OnObj(int index, obj::Type type, NumericExpr expr) {
    SetObj(builder_.obj(index), type, expr);
    notify_obj_added();
  }